

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TElasticity3DAnalytic::TElasticity3DAnalytic(TElasticity3DAnalytic *this,TElasticity3DAnalytic *cp)

{
  long in_RSI;
  TPZAnalyticSolution *in_RDI;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  TPZAnalyticSolution *in_stack_ffffffffffffffe0;
  
  TPZAnalyticSolution::TPZAnalyticSolution(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_TPZAnalyticSolution = (_func_int **)&PTR__TElasticity3DAnalytic_025a3270;
  *(undefined4 *)&in_RDI->field_0xc = *(undefined4 *)(in_RSI + 0xc);
  in_RDI[1]._vptr_TPZAnalyticSolution = *(_func_int ***)(in_RSI + 0x10);
  *(undefined8 *)&in_RDI[1].fSignConvention = *(undefined8 *)(in_RSI + 0x18);
  std::operator<<((ostream *)&std::cout,
                  "TElasticity3DAnalytic::TElasticity3DAnalytic(const TElasticity3DAnalytic &cp): One should not invoke this copy constructor"
                 );
  pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  return;
}

Assistant:

TElasticity3DAnalytic::TElasticity3DAnalytic(const TElasticity3DAnalytic &cp) : TPZAnalyticSolution(cp),fProblemType(cp.fProblemType),fE(cp.fE),fPoisson(cp.fPoisson) {
    std::cout << "TElasticity3DAnalytic::TElasticity3DAnalytic(const TElasticity3DAnalytic &cp): One should not invoke this copy constructor";
    DebugStop();
}